

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

index_t __thiscall xLearn::FromDMReader::Samples(FromDMReader *this,DMatrix **matrix)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DMatrix *pDVar4;
  pointer puVar5;
  pointer puVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  uVar1 = this->num_samples_;
  if ((ulong)uVar1 != 0) {
    uVar2 = this->pos_;
    uVar8 = (ulong)uVar2;
    uVar9 = 0;
    do {
      if ((ulong)this->data_ptr_->row_length <= uVar8 + uVar9) {
        if (uVar9 == 0) {
          if ((this->super_Reader).shuffle_ == true) {
            srand((this->super_Reader).seed_ + 1);
            puVar5 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar6 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((puVar5 != puVar6) && (puVar5 + 1 != puVar6)) {
              lVar11 = 4;
              do {
                iVar7 = rand();
                lVar10 = (long)iVar7 % ((lVar11 >> 2) + 1);
                if (lVar11 != lVar10 * 4) {
                  uVar1 = *(uint *)((long)puVar5 + lVar11);
                  *(uint *)((long)puVar5 + lVar11) = puVar5[lVar10];
                  puVar5[lVar10] = uVar1;
                }
                lVar10 = lVar11 + 4;
                lVar11 = lVar11 + 4;
              } while ((pointer)((long)puVar5 + lVar10) != puVar6);
            }
          }
          *matrix = (DMatrix *)0x0;
          return 0;
        }
        break;
      }
      (this->super_Reader).data_samples_.row.
      super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar9] =
           (this->data_ptr_->row).
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8 + uVar9]];
      pDVar4 = this->data_ptr_;
      uVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[uVar8 + uVar9];
      (this->super_Reader).data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl
      .super__Vector_impl_data._M_start[uVar9] =
           (pDVar4->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
      (this->super_Reader).data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar9] =
           (pDVar4->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
      this->pos_ = uVar2 + 1 + (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  *matrix = &(this->super_Reader).data_samples_;
  return this->num_samples_;
}

Assistant:

index_t FromDMReader::Samples(DMatrix* &matrix) {
  for (int i = 0; i < num_samples_; ++i) {
    if (pos_ >= this->data_ptr_->row_length) {
      // End of the data buffer
      if (i == 0) {
        if (shuffle_) {
          srand(this->seed_+1);
          random_shuffle(order_.begin(), order_.end());
        }
        matrix = nullptr;
        return 0;
      }
      break;
    }
    // Copy data between different DMatrix.
    data_samples_.row[i] = this->data_ptr_->row[order_[pos_]];
    data_samples_.Y[i] = this->data_ptr_->Y[order_[pos_]];
    data_samples_.norm[i] = this->data_ptr_->norm[order_[pos_]];
    pos_++;
  }
  matrix = &data_samples_;
  return num_samples_;
}